

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::ProgramNotFoundException::ProgramNotFoundException
          (ProgramNotFoundException *this,ProgramIdentifier *id,string *reason)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"Program ",&id->testCasePath);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_b8 = *plVar2;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar2;
    local_c8 = (long *)*plVar1;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)(id->programName)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*plVar1;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(reason->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68.field_2._8_8_ = plVar1[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_68._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_00d49cd0;
  return;
}

Assistant:

ProgramNotFoundException (const ProgramIdentifier& id, const std::string& reason)
		: tcu::ResourceError("Program " + id.testCasePath + " / '" + id.programName + "' not found: " + reason)
	{
	}